

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_pusher.cpp
# Opt level: O2

void __thiscall DPusher::ChangeValues(DPusher *this,int magnitude,int angle)

{
  DAngle ang;
  TAngle<double> local_28;
  double dStack_20;
  
  TAngle<double>::ToVector(&local_28,(double)magnitude);
  (this->m_PushVec).X = local_28.Degrees;
  (this->m_PushVec).Y = dStack_20;
  this->m_Magnitude = (double)magnitude;
  return;
}

Assistant:

void ChangeValues (int magnitude, int angle)
	{
		DAngle ang = angle * (360. / 256.);
		m_PushVec = ang.ToVector(magnitude);
		m_Magnitude = magnitude;
	}